

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

int __thiscall CSnapshot::Crc(CSnapshot *this)

{
  CSnapshotItem *this_00;
  int *piVar1;
  CSnapshot *in_RDI;
  int b;
  int Size;
  CSnapshotItem *pItem;
  int i;
  int Crc;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < in_RDI->m_NumItems; local_10 = local_10 + 1) {
    this_00 = GetItem((CSnapshot *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (int)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffe4 = GetItemSize(in_RDI,in_stack_ffffffffffffffd4);
    for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < in_stack_ffffffffffffffe4 / 4;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
      piVar1 = CSnapshotItem::Data(this_00);
      local_c = piVar1[in_stack_ffffffffffffffd4] + local_c;
    }
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffd4;
  }
  return local_c;
}

Assistant:

int CSnapshot::Crc() const
{
	int Crc = 0;

	for(int i = 0; i < m_NumItems; i++)
	{
		const CSnapshotItem *pItem = GetItem(i);
		int Size = GetItemSize(i);

		for(int b = 0; b < Size/4; b++)
			Crc += pItem->Data()[b];
	}
	return Crc;
}